

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmi_info.hpp
# Opt level: O0

void __thiscall license::os::DmiInfo::~DmiInfo(DmiInfo *this)

{
  DmiInfo *this_local;
  
  this->_vptr_DmiInfo = (_func_int **)&PTR__DmiInfo_001ff218;
  std::__cxx11::string::~string((string *)&this->m_cpu_manufacturer);
  std::__cxx11::string::~string((string *)&this->m_bios_description);
  std::__cxx11::string::~string((string *)&this->m_bios_vendor);
  std::__cxx11::string::~string((string *)&this->m_sys_vendor);
  return;
}

Assistant:

const std::string& bios_vendor() const { return m_bios_vendor; }